

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.c++
# Opt level: O0

void __thiscall
kj::_::HeapArrayDisposer::disposeImpl
          (HeapArrayDisposer *this,void *firstElement,size_t elementSize,size_t elementCount,
          size_t capacity,_func_void_void_ptr *destroyElement)

{
  undefined1 local_60 [8];
  ExceptionSafeArrayUtil guard;
  AutoDeleter deleter;
  _func_void_void_ptr *destroyElement_local;
  size_t capacity_local;
  size_t elementCount_local;
  size_t elementSize_local;
  void *firstElement_local;
  HeapArrayDisposer *this_local;
  
  AutoDeleter::AutoDeleter((AutoDeleter *)&guard.destroyElement,firstElement);
  if (destroyElement != (_func_void_void_ptr *)0x0) {
    ExceptionSafeArrayUtil::ExceptionSafeArrayUtil
              ((ExceptionSafeArrayUtil *)local_60,firstElement,elementSize,elementCount,
               destroyElement);
    ExceptionSafeArrayUtil::destroyAll((ExceptionSafeArrayUtil *)local_60);
    ExceptionSafeArrayUtil::~ExceptionSafeArrayUtil((ExceptionSafeArrayUtil *)local_60);
  }
  AutoDeleter::~AutoDeleter((AutoDeleter *)&guard.destroyElement);
  return;
}

Assistant:

void HeapArrayDisposer::disposeImpl(
    void* firstElement, size_t elementSize, size_t elementCount, size_t capacity,
    void (*destroyElement)(void*)) const {
  // Note that capacity is ignored since operator delete() doesn't care about it.
  AutoDeleter deleter(firstElement);

  if (destroyElement != nullptr) {
    ExceptionSafeArrayUtil guard(firstElement, elementSize, elementCount, destroyElement);
    guard.destroyAll();
  }
}